

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

void __thiscall chrono::ChSystem::Setup(ChSystem *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  element_type *peVar9;
  int iVar10;
  rep_conflict rVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  utils::ChProfileManager::Start_Profile("Setup");
  rVar11 = std::chrono::_V2::system_clock::now();
  (this->timer_setup).m_start.__d.__r = rVar11;
  this->ncoords = 0;
  this->ndoc = 0;
  this->ncoords_w = 0;
  this->ndoc_w = 0;
  this->ndoc_w_C = 0;
  this->ndoc_w_D = 0;
  ChAssembly::Setup(&this->assembly);
  this->ncoords = this->ncoords + (this->assembly).ncoords;
  uVar1 = (this->assembly).ncoords_w;
  uVar5 = (this->assembly).ndoc_w;
  auVar13._4_4_ = uVar5;
  auVar13._0_4_ = uVar1;
  uVar2 = this->ncoords_w;
  uVar6 = this->ndoc_w;
  auVar14._4_4_ = uVar6;
  auVar14._0_4_ = uVar2;
  auVar13._8_8_ = 0;
  auVar14._8_8_ = 0;
  auVar13 = vpaddd_avx(auVar14,auVar13);
  this->ncoords_w = (int)auVar13._0_8_;
  this->ndoc_w = (int)((ulong)auVar13._0_8_ >> 0x20);
  uVar3 = (this->assembly).ndoc_w_C;
  uVar7 = (this->assembly).ndoc_w_D;
  auVar15._4_4_ = uVar7;
  auVar15._0_4_ = uVar3;
  uVar4 = this->ndoc_w_C;
  uVar8 = this->ndoc_w_D;
  auVar16._4_4_ = uVar8;
  auVar16._0_4_ = uVar4;
  auVar15._8_8_ = 0;
  auVar16._8_8_ = 0;
  auVar14 = vpaddd_avx(auVar16,auVar15);
  this->ndoc_w_C = (int)auVar14._0_8_;
  this->ndoc_w_D = (int)((ulong)auVar14._0_8_ >> 0x20);
  peVar9 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar9->super_ChPhysicsItem).offset_L =
       auVar13._4_4_ + (this->assembly).super_ChPhysicsItem.offset_L;
  iVar10 = (*(peVar9->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x18])();
  this->ndoc_w = this->ndoc_w + iVar10;
  iVar10 = (*(((this->contact_container).
               super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x19])();
  this->ndoc_w_C = this->ndoc_w_C + iVar10;
  iVar10 = (*(((this->contact_container).
               super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1a])();
  this->ndoc_w_D = this->ndoc_w_D + iVar10;
  iVar10 = (this->assembly).nbodies + this->ndoc_w;
  this->ndoc = iVar10;
  this->nsysvars = this->ncoords + iVar10;
  this->nsysvars_w = this->ndoc_w + this->ncoords_w;
  this->ndof = this->ncoords - iVar10;
  lVar12 = std::chrono::_V2::system_clock::now();
  (this->timer_setup).m_end.__d.__r = lVar12;
  (this->timer_setup).m_total.__r =
       (double)(lVar12 - (this->timer_setup).m_start.__d.__r) / 1000000000.0 +
       (this->timer_setup).m_total.__r;
  utils::ChProfileManager::Stop_Profile();
  return;
}

Assistant:

void ChSystem::Setup() {
    CH_PROFILE("Setup");

    timer_setup.start();

    ncoords = 0;
    ncoords_w = 0;
    ndoc = 0;
    ndoc_w = 0;
    ndoc_w_C = 0;
    ndoc_w_D = 0;

    // Set up the underlying assembly (compute offsets of bodies, links, etc.)
    assembly.Setup();
    ncoords += assembly.ncoords;
    ncoords_w += assembly.ncoords_w;
    ndoc_w += assembly.ndoc_w;
    ndoc_w_C += assembly.ndoc_w_C;
    ndoc_w_D += assembly.ndoc_w_D;

    // Compute offsets for contact container
    contact_container->SetOffset_L(assembly.offset_L + ndoc_w);
    ndoc_w += contact_container->GetDOC();
    ndoc_w_C += contact_container->GetDOC_c();
    ndoc_w_D += contact_container->GetDOC_d();

    ndoc = ndoc_w + assembly.nbodies;  // number of constraints including quaternion constraints.
    nsysvars = ncoords + ndoc;         // total number of variables (coordinates + lagrangian multipliers)
    nsysvars_w = ncoords_w + ndoc_w;   // total number of variables (with 6 dof per body)

    ndof = ncoords - ndoc;  // number of degrees of freedom (approximate - does not consider constr. redundancy, etc)

    timer_setup.stop();

#ifdef _DEBUG
    // BOOKKEEPING SANITY CHECK
    // Test if the bookkeeping is properly aligned, at least for state gather/scatters,
    // by filling a marked vector, and see if some gaps or overlaps are remaining.

    bool check_bookkeeping = false;
    if (check_bookkeeping) {
        ChState test_x(GetNcoords_x(), this);
        ChStateDelta test_v(GetNcoords_w(), this);
        ChStateDelta test_a(GetNcoords_w(), this);
        ChVectorDynamic<> test_L(GetNconstr());
        double poison_x = -8888.888;
        double poison_v = -9999.999;
        double poison_a = -7777.777;
        double poison_L = 55555.555;
        double test_T;
        test_x.setConstant(poison_x);  // poison x
        test_v.setConstant(poison_v);  // poison v
        test_a.setConstant(poison_a);  // poison a
        test_L.setConstant(poison_L);  // poison L
        StateGather(test_x, test_v, test_T);
        StateGatherAcceleration(test_a);
        StateGatherReactions(test_L);
        for (int i = 0; i < test_x.size(); ++i)
            assert(test_x(i) != poison_x);  // if your debugger breaks here, some ChPhysicsItem has a wrong
                                            // implementation of offsets or DOFs for positions
        for (int i = 0; i < test_v.size(); ++i)
            assert(test_v(i) != poison_v);  // if your debugger breaks here, some ChPhysicsItem has a wrong
                                            // implementation of offsets or DOFs for velocities
        for (int i = 0; i < test_a.size(); ++i)
            assert(test_a(i) != poison_a);  // if your debugger breaks here, some ChPhysicsItem has a wrong
                                            // implementation of offsets or DOFs for accelerations
        for (int i = 0; i < test_L.size(); ++i)
            assert(test_L(i) != poison_L);  // if your debugger breaks here, some ChPhysicsItem has a wrong
                                            // implementation of offsets or DOFs for reaction forces
    }
#endif  // _DEBUG
}